

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O3

char nivalis::OpCode::to_char(uint32_t opcode)

{
  if ((int)opcode < 0x40) {
    if ((int)opcode < 0x30) {
      if (opcode == 0x20) {
        return '+';
      }
      if (opcode == 0x21) {
        return '-';
      }
    }
    else {
      if (opcode == 0x30) {
        return '*';
      }
      if (opcode == 0x31) {
        return '/';
      }
      if (opcode == 0x32) {
        return '%';
      }
    }
  }
  else if ((int)opcode < 0x60) {
    if (opcode == 0x40) {
      return '^';
    }
    if (opcode == 0x52) {
      return '&';
    }
    if (opcode == 0x53) {
      return '|';
    }
  }
  else {
    if (opcode == 0x60) {
      return '<';
    }
    if (opcode == 0x62) {
      return '=';
    }
    if (opcode == 0x65) {
      return '>';
    }
  }
  return '\0';
}

Assistant:

char to_char(uint32_t opcode) {
    switch (opcode) {
        case OpCode::add: return '+';
        case OpCode::sub: return '-';
        case OpCode::mul: return '*';
        case OpCode::divi: return '/';
        case OpCode::mod: return '%';
        case OpCode::power: return '^';
        case OpCode::lt: return '<';
        case OpCode::gt: return '>';
        case OpCode::eq: return '=';
        case OpCode::land: return '&';
        case OpCode::lor: return '|';
        default: return 0;
    };
}